

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool __thiscall ON_SubD::IsValid(ON_SubD *this,ON_TextLog *text_logx)

{
  ON_SubDimple *this_00;
  bool bVar1;
  
  this_00 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 != (ON_SubDimple *)0x0) {
    bVar1 = ON_SubDimple::IsValid
                      (this_00,this,(bool)((byte)text_logx & 1),
                       (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe));
    return bVar1;
  }
  bVar1 = ON_SubDIsNotValid((bool)((byte)text_logx & 1));
  return bVar1;
}

Assistant:

bool ON_SubD::IsValid(ON_TextLog* text_logx) const
{
  // If low bit of text_log pointer is 1, then ON_Error is not called when the
  // subd is invalid.
  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  const bool bSilentError = (0 != (lowbit & ((ON__INT_PTR)text_logx)));
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);
  
  const ON_SubDimple* subdimple = SubDimple();
  if (nullptr == subdimple)
    return ON_SubDIsNotValid(bSilentError);

  return subdimple->IsValid(*this, bSilentError, text_log);
}